

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpec::Pattern::Pattern(Pattern *this,string *name)

{
  this->_vptr_Pattern = (_func_int **)&PTR__Pattern_001de770;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

TestSpec::Pattern::Pattern( std::string const& name )
    : m_name( name )
    {}